

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O2

OPJ_BOOL opj_set_decoded_resolution_factor(opj_codec_t *p_codec,OPJ_UINT32 res_factor)

{
  OPJ_BOOL OVar1;
  opj_codec_private_t *l_codec;
  
  if (p_codec != (opj_codec_t *)0x0) {
    OVar1 = (*(code *)p_codec[9])(p_codec[0xb],res_factor,p_codec + 0xc);
    return OVar1;
  }
  return 0;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_set_decoded_resolution_factor(opj_codec_t *p_codec,
        OPJ_UINT32 res_factor)
{
    opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;

    if (!l_codec) {
        return OPJ_FALSE;
    }

    return l_codec->m_codec_data.m_decompression.opj_set_decoded_resolution_factor(
               l_codec->m_codec,
               res_factor,
               &(l_codec->m_event_mgr));
}